

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_array_add_strkey_elem(jx9_value *pArray,char *zKey,jx9_value *pValue)

{
  char *pcVar1;
  sxi32 sVar2;
  char *pcVar3;
  anon_union_8_3_18420de5_for_x local_68;
  undefined8 uStack_60;
  jx9_vm *local_58;
  jx9_vm *pjStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  sVar2 = -0x18;
  if ((pArray->iFlags & 0x40) != 0) {
    if ((zKey == (char *)0x0) || (*zKey == '\0')) {
      sVar2 = HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)0x0,pValue);
      return sVar2;
    }
    local_58 = pArray->pVm;
    local_68.rVal = 0.0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uStack_60 = 1;
    pcVar1 = zKey + 2;
    do {
      pcVar3 = pcVar1;
      if (pcVar3[-1] == '\0') {
        pcVar3 = pcVar3 + -1;
        goto LAB_0010cfb7;
      }
      if (*pcVar3 == '\0') goto LAB_0010cfb7;
      if (pcVar3[1] == '\0') {
        pcVar3 = pcVar3 + 1;
        goto LAB_0010cfb7;
      }
      pcVar1 = pcVar3 + 4;
    } while (pcVar3[2] != '\0');
    pcVar3 = pcVar3 + 2;
LAB_0010cfb7:
    pjStack_50 = local_58;
    jx9MemObjStringAppend((jx9_value *)&local_68,zKey,(int)pcVar3 - (int)zKey);
    sVar2 = HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)&local_68,pValue);
    jx9MemObjRelease((jx9_value *)&local_68);
  }
  return sVar2;
}

Assistant:

JX9_PRIVATE int jx9_array_add_strkey_elem(jx9_value *pArray, const char *zKey, jx9_value *pValue)
{
	int rc;
	/* Make sure we are dealing with a valid hashmap */
	if( (pArray->iFlags & MEMOBJ_HASHMAP) == 0 ){
		return JX9_CORRUPT;
	}
	/* Perform the insertion */
	if( SX_EMPTY_STR(zKey) ){
		/* Empty key, assign an automatic index */
		rc = jx9HashmapInsert((jx9_hashmap *)pArray->x.pOther, 0, &(*pValue));
	}else{
		jx9_value sKey;
		jx9MemObjInitFromString(pArray->pVm, &sKey, 0);
		jx9MemObjStringAppend(&sKey, zKey, (sxu32)SyStrlen(zKey));
		rc = jx9HashmapInsert((jx9_hashmap *)pArray->x.pOther, &sKey, &(*pValue));
		jx9MemObjRelease(&sKey);
	}
	return rc;
}